

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_sstream.c
# Opt level: O2

double HTS_set_specified_duration
                 (size_t *duration,double *mean,double *vari,size_t size,double frame_length)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  dVar9 = 1.0;
  if (1.0 <= frame_length + 0.5) {
    dVar9 = frame_length + 0.5;
  }
  uVar2 = (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f | (long)dVar9;
  if (size < uVar2) {
    dVar11 = 0.0;
    dVar13 = 0.0;
    for (sVar3 = 0; size != sVar3; sVar3 = sVar3 + 1) {
      dVar11 = dVar11 + mean[sVar3];
      dVar13 = dVar13 + vari[sVar3];
    }
    auVar12._8_4_ = (int)(uVar2 >> 0x20);
    auVar12._0_8_ = uVar2;
    auVar12._12_4_ = 0x45300000;
    dVar9 = (auVar12._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
    dVar13 = (dVar9 - dVar11) / dVar13;
    uVar4 = 0;
    for (sVar3 = 0; size != sVar3; sVar3 = sVar3 + 1) {
      dVar11 = vari[sVar3] * dVar13 + mean[sVar3] + 0.5;
      dVar14 = 1.0;
      if (1.0 <= dVar11) {
        dVar14 = dVar11;
      }
      uVar6 = (long)(dVar14 - 9.223372036854776e+18) & (long)dVar14 >> 0x3f | (long)dVar14;
      duration[sVar3] = uVar6;
      uVar4 = uVar4 + uVar6;
    }
    for (; uVar4 != uVar2; uVar4 = uVar4 + lVar8) {
      if (uVar4 < uVar2) {
        uVar6 = 0xffffffff;
        for (uVar7 = 0; iVar5 = (int)uVar6, lVar8 = 1, size != uVar7; uVar7 = uVar7 + 1) {
          sVar3 = duration[uVar7];
          auVar15._8_4_ = (int)(sVar3 >> 0x20);
          auVar15._0_8_ = sVar3;
          auVar15._12_4_ = 0x45300000;
          dVar14 = ABS(dVar13 - (((auVar15._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0) +
                                 1.0) - mean[uVar7]) / vari[uVar7]);
          if (dVar14 < dVar11 || iVar5 < 0) {
            uVar6 = uVar7 & 0xffffffff;
            dVar11 = dVar14;
          }
        }
      }
      else {
        uVar6 = 0xffffffff;
        for (uVar7 = 0; iVar5 = (int)uVar6, lVar8 = -1, size != uVar7; uVar7 = uVar7 + 1) {
          uVar1 = duration[uVar7];
          if ((1 < uVar1) &&
             ((auVar16._8_4_ = (int)(uVar1 >> 0x20), auVar16._0_8_ = uVar1,
              auVar16._12_4_ = 0x45300000,
              dVar14 = ABS(dVar13 - (((auVar16._8_8_ - 1.9342813113834067e+25) +
                                      ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)
                                     + -1.0) - mean[uVar7]) / vari[uVar7]), iVar5 < 0 ||
              (dVar14 < dVar11)))) {
            uVar6 = uVar7 & 0xffffffff;
            dVar11 = dVar14;
          }
        }
      }
      duration[iVar5] = duration[iVar5] + lVar8;
    }
  }
  else {
    if (uVar2 < size) {
      HTS_error(-1,"HTS_set_specified_duration: Specified frame length is too short.\n");
    }
    for (sVar3 = 0; size != sVar3; sVar3 = sVar3 + 1) {
      duration[sVar3] = 1;
    }
    auVar10._8_4_ = (int)(size >> 0x20);
    auVar10._0_8_ = size;
    auVar10._12_4_ = 0x45300000;
    dVar9 = (auVar10._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)size) - 4503599627370496.0);
  }
  return dVar9;
}

Assistant:

static double HTS_set_specified_duration(size_t * duration, double *mean, double *vari, size_t size, double frame_length)
{
   size_t i;
   int j;
   double temp1, temp2;
   double rho = 0.0;
   size_t sum = 0;
   size_t target_length;

   /* get the target frame length */
   if (frame_length + 0.5 < 1.0)
      target_length = 1;
   else
      target_length = (size_t) (frame_length + 0.5);

   /* check the specified duration */
   if (target_length <= size) {
      if (target_length < size)
         HTS_error(-1, "HTS_set_specified_duration: Specified frame length is too short.\n");
      for (i = 0; i < size; i++)
         duration[i] = 1;
      return (double) size;
   }

   /* RHO calculation */
   temp1 = 0.0;
   temp2 = 0.0;
   for (i = 0; i < size; i++) {
      temp1 += mean[i];
      temp2 += vari[i];
   }
   rho = ((double) target_length - temp1) / temp2;

   /* first estimation */
   for (i = 0; i < size; i++) {
      temp1 = mean[i] + rho * vari[i] + 0.5;
      if (temp1 < 1.0)
         duration[i] = 1;
      else
         duration[i] = (size_t) temp1;
      sum += duration[i];
   }

   /* loop estimation */
   while (target_length != sum) {
      /* sarch flexible state and modify its duration */
      if (target_length > sum) {
         j = -1;
         for (i = 0; i < size; i++) {
            temp2 = fabs(rho - ((double) duration[i] + 1 - mean[i]) / vari[i]);
            if (j < 0 || temp1 > temp2) {
               j = i;
               temp1 = temp2;
            }
         }
         sum++;
         duration[j]++;
      } else {
         j = -1;
         for (i = 0; i < size; i++) {
            if (duration[i] > 1) {
               temp2 = fabs(rho - ((double) duration[i] - 1 - mean[i]) / vari[i]);
               if (j < 0 || temp1 > temp2) {
                  j = i;
                  temp1 = temp2;
               }
            }
         }
         sum--;
         duration[j]--;
      }
   }

   return (double) target_length;
}